

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_kernel xmrig::OclLib::createKernel(cl_program program,char *kernel_name,cl_int *errcode_ret)

{
  char *pcVar1;
  char *pcVar2;
  cl_int *in_RDX;
  char *in_RSI;
  cl_program in_RDI;
  cl_kernel result;
  cl_kernel local_8;
  
  local_8 = (*pCreateKernel)(in_RDI,in_RSI,in_RDX);
  if (*in_RDX != 0) {
    pcVar1 = ocl_tag();
    pcVar2 = OclError::toString(*in_RDX);
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31mclCreateKernel\x1b[0m\x1b[0;31m for kernel \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar1,pcVar2,in_RSI);
    local_8 = (cl_kernel)0x0;
  }
  return local_8;
}

Assistant:

cl_kernel xmrig::OclLib::createKernel(cl_program program, const char *kernel_name, cl_int *errcode_ret) noexcept
{
    assert(pCreateKernel != nullptr);

    auto result = pCreateKernel(program, kernel_name, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("clCreateKernel") RED(" for kernel ") RED_BOLD("%s"),
                ocl_tag(), OclError::toString(*errcode_ret), kernel_name);

        return nullptr;
    }

    return result;
}